

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::GetIDType(SQLexer *this,SQChar *s,SQInteger len)

{
  SQUnsignedInteger *pSVar1;
  int iVar2;
  ulong uVar3;
  SQObjectValue *pSVar4;
  SQObjectValue SVar5;
  char *pcVar6;
  ulong uVar7;
  _HashNode *p_Var8;
  SQObjectPtr t;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_20.super_SQObject._type = OT_NULL;
  uVar3 = (ulong)len >> 5 | 1;
  pcVar6 = s;
  uVar7 = len;
  if (uVar3 <= (ulong)len) {
    do {
      len = len ^ (ulong)(ushort)(short)*pcVar6 + ((ulong)len >> 2) + len * 0x20;
      uVar7 = uVar7 - uVar3;
      pcVar6 = pcVar6 + 1;
    } while (uVar3 <= uVar7);
  }
  p_Var8 = this->_keywords->_nodes + (this->_keywords->_numofnodes - 1U & len);
  do {
    if (((p_Var8->key).super_SQObject._type == OT_STRING) &&
       (iVar2 = strcmp((char *)&((p_Var8->key).super_SQObject._unVal.pOuter)->_idx,s), iVar2 == 0))
    goto LAB_001196ff;
    p_Var8 = p_Var8->next;
  } while (p_Var8 != (_HashNode *)0x0);
  p_Var8 = (_HashNode *)0x0;
LAB_001196ff:
  if (p_Var8 != (_HashNode *)0x0) {
    local_20.super_SQObject._type = (p_Var8->val).super_SQObject._type;
    pSVar4 = &(p_Var8->val).super_SQObject._unVal;
    if (local_20.super_SQObject._type == OT_WEAKREF) {
      local_20.super_SQObject._type = *(SQObjectType *)&pSVar4->pString->_sharedstate;
      pSVar4 = (SQObjectValue *)&pSVar4->pString->_next;
    }
    local_20.super_SQObject._unVal.pWeakRef = (SQWeakRef *)pSVar4->pTable;
    if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
  }
  SVar5.nInteger = 0x102;
  if (p_Var8 != (_HashNode *)0x0) {
    SVar5 = local_20.super_SQObject._unVal;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return (SQInteger)SVar5.pTable;
}

Assistant:

SQInteger SQLexer::GetIDType(const SQChar *s,SQInteger len)
{
    SQObjectPtr t;
    if(_keywords->GetStr(s,len, t)) {
        return SQInteger(_integer(t));
    }
    return TK_IDENTIFIER;
}